

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CGlyphIndex,_allocator_default<CGlyphIndex>_>::alloc
          (array<CGlyphIndex,_allocator_default<CGlyphIndex>_> *this,int new_len)

{
  undefined8 uVar1;
  CGlyphIndex *pCVar2;
  CGlyphIndex *pCVar3;
  undefined8 *puVar4;
  undefined4 in_ESI;
  long *in_RDI;
  int i;
  int end;
  CGlyphIndex *new_list;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar5;
  int iVar6;
  int local_20;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  pCVar2 = allocator_default<CGlyphIndex>::alloc_array(0);
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    iVar6 = *(int *)((long)in_RDI + 0xc);
  }
  else {
    iVar6 = (int)in_RDI[1];
  }
  for (local_20 = 0; local_20 < iVar6; local_20 = local_20 + 1) {
    puVar4 = (undefined8 *)(*in_RDI + (long)local_20 * 0x10);
    pCVar3 = pCVar2 + local_20;
    uVar1 = *puVar4;
    pCVar3->m_FontSizeIndex = (int)uVar1;
    pCVar3->m_ID = (int)((ulong)uVar1 >> 0x20);
    pCVar3->m_pGlyph = (CGlyph *)puVar4[1];
  }
  allocator_default<CGlyphIndex>::free_array
            ((CGlyphIndex *)CONCAT44(iVar6,in_stack_ffffffffffffffd0));
  if (*(int *)((long)in_RDI + 0xc) < (int)in_RDI[1]) {
    uVar5 = *(undefined4 *)((long)in_RDI + 0xc);
  }
  else {
    uVar5 = (undefined4)in_RDI[1];
  }
  *(undefined4 *)((long)in_RDI + 0xc) = uVar5;
  *in_RDI = (long)pCVar2;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}